

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_FlagFileTest_FailReadFlagsFromString::Run(void)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  pointer __dest;
  char *pcVar4;
  undefined8 extraout_RAX;
  FlagSaver fs;
  size_type __dnew;
  FlagSaver FStack_48;
  string local_40;
  size_type local_20;
  
  FlagSaver::FlagSaver(&FStack_48);
  fprintf(_stderr,"Running test %s/%s\n","FlagFileTest","FailReadFlagsFromString");
  fLI::FLAGS_test_int32 = 0x77;
  local_20 = 0x76;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_20);
  sVar1 = local_20;
  local_40.field_2._M_allocated_capacity = local_20;
  local_40._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "# let\'s make sure it can update values\n-test_string=non_initial\n-test_bool=false\n-test_int32=123\n-test_double=illegal\n"
         ,0x76);
  local_40._M_string_length = sVar1;
  __dest[sVar1] = '\0';
  pcVar4 = GetArgv0();
  bVar2 = ReadFlagsFromString(&local_40,pcVar4,false);
  if (bVar2) {
    _GLOBAL__N_1::Test_FlagFileTest_FailReadFlagsFromString::Run();
  }
  else if (fLI::FLAGS_test_int32 == 0x77) {
    iVar3 = std::__cxx11::string::compare(fLS::FLAGS_test_string_abi_cxx11_);
    if (iVar3 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      FlagSaver::~FlagSaver(&FStack_48);
      return;
    }
    goto LAB_00136151;
  }
  _GLOBAL__N_1::Test_FlagFileTest_FailReadFlagsFromString::Run();
LAB_00136151:
  _GLOBAL__N_1::Test_FlagFileTest_FailReadFlagsFromString::Run();
  FlagSaver::~FlagSaver(&FStack_48);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FlagFileTest, FailReadFlagsFromString) {
  FLAGS_test_int32 = 119;
  string flags("# let's make sure it can update values\n"
               "-test_string=non_initial\n"
               "-test_bool=false\n"
               "-test_int32=123\n"
               "-test_double=illegal\n");

  EXPECT_FALSE(ReadFlagsFromString(flags,
                                   GetArgv0(),
                                   // errors are fatal
                                   false));

  EXPECT_EQ(119, FLAGS_test_int32);
  EXPECT_EQ("initial", FLAGS_test_string);
}